

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  uint *puVar1;
  u16 uVar2;
  ushort uVar3;
  uint uVar4;
  sqlite3_io_methods *psVar5;
  Wal *pWVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  u32 uVar10;
  ht_slot *aTmp;
  long lVar11;
  uint uVar12;
  u64 n;
  int iVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  u32 *puVar17;
  ulong uVar18;
  uint *puVar19;
  long lVar20;
  char cVar21;
  bool bVar22;
  int nList;
  ht_slot *aMerge;
  int isChanged;
  i64 nSize;
  i64 nReq;
  uint local_1c8;
  uint local_1c0;
  char local_1b9;
  uint *local_1b8;
  u32 *local_1b0;
  uint local_1a8;
  uint local_1a4;
  void *local_1a0;
  Wal *local_198;
  ulong local_190;
  _func_int_void_ptr *local_188;
  ht_slot *local_180;
  int local_174;
  long local_170;
  long local_168;
  ulong local_160;
  uint local_158;
  int local_154;
  ulong local_150;
  ulong local_148;
  uint *local_140;
  WalHashLoc local_138;
  ulong local_120;
  long local_118;
  sqlite3 *local_110;
  long local_108;
  uint local_100 [52];
  
  local_174 = 0;
  if (pWal->readOnly != '\0') {
    return 8;
  }
  iVar7 = 0;
  if (pWal->exclusiveMode == '\0') {
    iVar7 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,10);
  }
  if (iVar7 != 0) {
    return iVar7;
  }
  pWal->ckptLock = '\x01';
  local_1a4 = sync_flags;
  local_154 = eMode;
  if (eMode == 0) {
    uVar8 = 0;
    iVar7 = 0;
  }
  else {
    do {
      uVar8 = 0;
      if (pWal->exclusiveMode == '\0') {
        uVar8 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,0,1,10);
      }
    } while (((xBusy != (_func_int_void_ptr *)0x0) && (uVar8 == 5)) &&
            (iVar7 = (*xBusy)(pBusyArg), iVar7 != 0));
    if (uVar8 == 5) {
      uVar8 = 0;
      iVar7 = 0;
      xBusy = (_func_int_void_ptr *)0x0;
    }
    else {
      iVar7 = eMode;
      if (uVar8 == 0) {
        pWal->writeLock = '\x01';
        uVar8 = 0;
      }
    }
  }
  local_110 = db;
  if ((uVar8 == 0) && (uVar8 = walIndexReadHdr(pWal,&local_174), local_174 != 0)) {
    psVar5 = pWal->pDbFd->pMethods;
    if (2 < psVar5->iVersion) {
      (*psVar5->xUnfetch)(pWal->pDbFd,0,(void *)0x0);
    }
  }
  if (uVar8 != 0) goto LAB_0013a72e;
  local_1c8 = (pWal->hdr).mxFrame;
  if ((local_1c8 == 0) || (uVar2 = (pWal->hdr).szPage, (CONCAT22(uVar2,uVar2) & 0x1fe00) == nBuf)) {
    uVar2 = (pWal->hdr).szPage;
    puVar17 = *pWal->apWiData;
    if (puVar17[0x18] < local_1c8) {
      local_1a8 = CONCAT22(uVar2,uVar2) & 0x1fe00;
      local_148 = (ulong)(pWal->hdr).nPage;
      uVar8 = 0;
      lVar20 = 1;
      local_1b0 = puVar17;
      local_1a0 = pBusyArg;
      do {
        uVar15 = puVar17[lVar20 + 0x19];
        if (uVar15 < local_1c8) {
          iVar13 = (int)lVar20 + 3;
          do {
            uVar8 = 0;
            if (pWal->exclusiveMode == '\0') {
              uVar8 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar13,1,10);
            }
          } while (((xBusy != (_func_int_void_ptr *)0x0) && (uVar8 == 5)) &&
                  (iVar9 = (*xBusy)(local_1a0), iVar9 != 0));
          puVar17 = local_1b0;
          if (uVar8 == 5) {
            iVar9 = 0;
            xBusy = (_func_int_void_ptr *)0x0;
            local_1c8 = uVar15;
          }
          else {
            iVar9 = 5;
            if (uVar8 == 0) {
              uVar10 = 0xffffffff;
              if (lVar20 == 1) {
                uVar10 = local_1c8;
              }
              local_1b0[lVar20 + 0x19] = uVar10;
              uVar8 = 0;
              if (pWal->exclusiveMode == '\0') {
                (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar13,1,9);
              }
              iVar9 = 0;
              puVar17 = local_1b0;
            }
          }
        }
        else {
          iVar9 = 0;
        }
        if (iVar9 != 0) {
          if (iVar9 != 5) goto LAB_0013b0b2;
          local_1b8 = (uint *)0x0;
          goto LAB_0013b0a8;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 5);
      local_198 = pWal;
      if (puVar17[0x18] < local_1c8) {
        uVar10 = puVar17[0x18];
        uVar8 = (pWal->hdr).mxFrame;
        local_150 = (ulong)uVar8;
        uVar18 = (ulong)(uVar8 + 0x1000) + 0xffffffff021 >> 0xc;
        local_168 = uVar18 << 0x20;
        n = (local_168 >> 0x1b) + local_150 * 2 + 0x28;
        local_188 = xBusy;
        iVar9 = sqlite3_initialize();
        if (iVar9 == 0) {
          local_1b8 = (uint *)sqlite3Malloc(n);
        }
        else {
          local_1b8 = (uint *)0x0;
        }
        if (local_1b8 == (uint *)0x0) {
          uVar8 = 7;
          pWal = local_198;
        }
        else {
          iVar9 = (int)uVar18;
          memset(local_1b8,0,n);
          local_1b8[1] = iVar9 + 1;
          iVar13 = sqlite3_initialize();
          if (iVar13 == 0) {
            uVar8 = 0x1000;
            if ((uint)local_150 < 0x1000) {
              uVar8 = (uint)local_150;
            }
            aTmp = (ht_slot *)sqlite3Malloc((ulong)(uVar8 * 2));
          }
          else {
            aTmp = (ht_slot *)0x0;
          }
          cVar21 = aTmp != (ht_slot *)0x0;
          uVar8 = 7;
          puVar17 = local_1b0;
          pWal = local_198;
          if (((bool)cVar21) &&
             (iVar13 = (int)((ulong)(uVar10 + 0x1001) + 0xffffffff021 >> 0xc), uVar8 = 0,
             iVar13 <= iVar9)) {
            local_140 = local_1b8 + 2;
            lVar20 = (long)iVar13;
            local_168 = local_168 >> 0x20;
            do {
              uVar8 = walHashGet(pWal,(int)lVar20,&local_138);
              cVar21 = uVar8 == 0;
              lVar11 = lVar20;
              if ((bool)cVar21) {
                puVar17 = local_138.aPgno + 1;
                if (lVar20 == local_168) {
                  local_190 = (ulong)((int)local_150 - local_138.iZero);
                }
                else {
                  local_190 = (ulong)((long)local_138.aHash - (long)puVar17) >> 2;
                }
                local_170 = (long)local_140 +
                            (ulong)local_138.iZero * 2 + (long)(int)local_1b8[1] * 0x20;
                local_158 = local_138.iZero + 1;
                local_1b9 = cVar21;
                local_138.aPgno = puVar17;
                local_138.iZero = local_158;
                local_118 = lVar20;
                if ((int)local_190 < 1) {
                  local_1c0 = 0;
                  local_180 = (ht_slot *)0x0;
                  memset(&local_108,0,0xd0);
                  uVar15 = 1;
                }
                else {
                  uVar16 = local_190 & 0xffffffff;
                  uVar18 = 0;
                  do {
                    *(short *)(local_170 + uVar18 * 2) = (short)uVar18;
                    uVar18 = uVar18 + 1;
                  } while (uVar16 != uVar18);
                  local_1c0 = 0;
                  local_180 = (ht_slot *)0x0;
                  local_120 = (ulong)uVar8;
                  memset(&local_108,0,0xd0);
                  uVar18 = 0;
                  local_160 = uVar16;
                  do {
                    local_1c0 = 1;
                    local_180 = (ht_slot *)(local_170 + uVar18 * 2);
                    uVar16 = 0;
                    if ((uVar18 & 1) != 0) {
                      uVar16 = 0;
                      do {
                        walMerge(puVar17,*(ht_slot **)(local_100 + uVar16 * 4),
                                 local_100[(uVar16 * 2 + -1) * 2],&local_180,(int *)&local_1c0,aTmp)
                        ;
                        uVar8 = (int)uVar16 + 1;
                        uVar16 = (ulong)uVar8;
                      } while (((uint)uVar18 >> (uVar8 & 0x1f) & 1) != 0);
                    }
                    *(ht_slot **)(local_100 + uVar16 * 4) = local_180;
                    local_100[(uVar16 * 2 + -1) * 2] = local_1c0;
                    uVar18 = uVar18 + 1;
                  } while (uVar18 != local_160);
                  uVar15 = (int)uVar16 + 1;
                  uVar8 = (uint)local_120;
                }
                if (uVar15 < 0xd) {
                  uVar16 = (ulong)uVar15;
                  puVar19 = local_100 + uVar16 * 4;
                  uVar18 = local_190;
                  do {
                    if (((uint)uVar18 >> ((uint)uVar16 & 0x1f) & 1) != 0) {
                      walMerge(puVar17,*(ht_slot **)puVar19,puVar19[-2],&local_180,(int *)&local_1c0
                               ,aTmp);
                      uVar18 = local_190;
                    }
                    uVar16 = uVar16 + 1;
                    puVar19 = puVar19 + 4;
                  } while ((int)uVar16 != 0xd);
                }
                local_140[local_118 * 8 + 7] = local_158;
                local_140[local_118 * 8 + 6] = local_1c0;
                *(long *)(local_140 + local_118 * 8 + 2) = local_170;
                *(u32 **)(local_140 + local_118 * 8 + 4) = puVar17;
                puVar17 = local_1b0;
                pWal = local_198;
                lVar11 = local_118;
                cVar21 = local_1b9;
              }
            } while ((uVar8 == 0) && (lVar20 = lVar11 + 1, lVar11 < local_168));
          }
          sqlite3_free(aTmp);
          xBusy = local_188;
          if (cVar21 != '\0') goto LAB_0013ad0e;
          sqlite3_free(local_1b8);
        }
        local_1b8 = (uint *)0x0;
        xBusy = local_188;
      }
      else {
        local_1b8 = (uint *)0x0;
      }
LAB_0013ad0e:
      pBusyArg = local_1a0;
      if (local_1b8 != (uint *)0x0) {
        do {
          uVar8 = 0;
          if (pWal->exclusiveMode == '\0') {
            uVar8 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,10);
          }
        } while (((xBusy != (_func_int_void_ptr *)0x0) && (uVar8 == 5)) &&
                (iVar9 = (*xBusy)(pBusyArg), iVar9 != 0));
        if (uVar8 == 0) {
          local_170 = CONCAT44(local_170._4_4_,puVar17[0x18]);
          puVar17[0x20] = local_1c8;
          local_1a4 = local_1a4 >> 2 & 3;
          if (local_1a4 == 0) {
            uVar8 = 0;
          }
          else {
            uVar8 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,local_1a4);
          }
          uVar15 = local_1a8;
          local_190 = (ulong)local_1a8;
          if (uVar8 == 0) {
            local_108 = local_148 * local_190;
            uVar8 = (*pWal->pDbFd->pMethods->xFileSize)(pWal->pDbFd,(sqlite3_int64 *)&local_138);
            if ((uVar8 == 0) && ((long)local_138.aHash < local_108)) {
              psVar5 = pWal->pDbFd->pMethods;
              if (psVar5 != (sqlite3_io_methods *)0x0) {
                (*psVar5->xFileControl)(pWal->pDbFd,5,&local_108);
              }
            }
          }
          puVar19 = local_1b8;
          local_160 = (ulong)(uVar15 | 0x18);
          uVar15 = 0;
          local_188 = xBusy;
          do {
            pWVar6 = local_198;
            if (uVar8 != 0) break;
            if ((long)(int)local_1b8[1] < 1) {
              uVar12 = 0xffffffff;
            }
            else {
              uVar8 = *local_1b8;
              uVar12 = 0xffffffff;
              lVar20 = (long)(int)local_1b8[1];
              do {
                lVar11 = lVar20 + -1;
                puVar1 = puVar19 + lVar11 * 8 + 2;
                uVar14 = puVar19[lVar11 * 8 + 2];
                do {
                  if ((int)puVar19[lVar11 * 8 + 8] <= (int)uVar14) break;
                  uVar3 = *(ushort *)(*(long *)(puVar1 + 2) + (long)(int)uVar14 * 2);
                  uVar4 = *(uint *)(*(long *)(puVar1 + 4) + (ulong)uVar3 * 4);
                  if (uVar8 < uVar4) {
                    if (uVar4 < uVar12) {
                      uVar15 = (uint)uVar3 + puVar1[7];
                      uVar12 = uVar4;
                    }
                  }
                  else {
                    uVar14 = uVar14 + 1;
                    *puVar1 = uVar14;
                  }
                } while (uVar4 <= uVar8);
                bVar22 = 1 < lVar20;
                lVar20 = lVar11;
              } while (bVar22);
            }
            *local_1b8 = uVar12;
            if (uVar12 == 0xffffffff) {
              uVar8 = 0;
              break;
            }
            if ((local_110->u1).isInterrupted == 0) {
              uVar8 = 0;
              if (((uint)local_170 < uVar15) && (uVar15 <= local_1c8)) {
                bVar22 = false;
                uVar8 = 0;
                if (uVar12 <= (uint)local_148) {
                  uVar8 = (*local_198->pWalFd->pMethods->xRead)
                                    (local_198->pWalFd,zBuf,local_1a8,
                                     (uVar15 - 1) * local_160 + 0x38);
                  if (uVar8 == 0) {
                    uVar8 = (*pWVar6->pDbFd->pMethods->xWrite)
                                      (pWVar6->pDbFd,zBuf,local_1a8,(uVar12 - 1) * local_190);
                    bVar22 = uVar8 != 0;
                    pBusyArg = local_1a0;
                  }
                  else {
                    bVar22 = true;
                    pBusyArg = local_1a0;
                  }
                }
              }
              else {
                bVar22 = false;
              }
            }
            else {
              bVar22 = true;
              uVar8 = (uint)(local_110->mallocFailed == '\0') * 2 + 7;
            }
          } while (!bVar22);
          xBusy = local_188;
          pWal = local_198;
          if (uVar8 == 0) {
            uVar8 = 0;
            if (((local_1c8 == (*local_198->apWiData)[4]) &&
                (uVar8 = (*local_198->pDbFd->pMethods->xTruncate)
                                   (local_198->pDbFd,(local_198->hdr).nPage * local_190),
                local_1a4 != 0)) && (uVar8 == 0)) {
              uVar8 = (*pWal->pDbFd->pMethods->xSync)(pWal->pDbFd,local_1a4);
            }
            if (uVar8 == 0) {
              local_1b0[0x18] = local_1c8;
              uVar8 = 0;
            }
          }
          puVar17 = local_1b0;
          if (pWal->exclusiveMode == '\0') {
            (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,9);
            puVar17 = local_1b0;
          }
        }
      }
      if (uVar8 == 5) {
        uVar8 = 0;
      }
    }
    else {
      local_1b8 = (uint *)0x0;
      uVar8 = 0;
    }
    if (((iVar7 != 0) && (uVar8 == 0)) &&
       ((uVar8 = 5, (pWal->hdr).mxFrame <= puVar17[0x18] && (uVar8 = 0, 1 < iVar7)))) {
      sqlite3_randomness(4,&local_108);
      do {
        uVar8 = 0;
        if (pWal->exclusiveMode == '\0') {
          uVar8 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
        }
      } while (((xBusy != (_func_int_void_ptr *)0x0) && (uVar8 == 5)) &&
              (iVar9 = (*xBusy)(pBusyArg), iVar9 != 0));
      if (uVar8 == 0) {
        uVar8 = 0;
        if (iVar7 == 3) {
          walRestartHdr(pWal,(u32)local_108);
          uVar8 = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,0);
        }
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
        }
      }
    }
LAB_0013b0a8:
    sqlite3_free(local_1b8);
  }
  else {
    uVar8 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xf1f3,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
  }
LAB_0013b0b2:
  if ((uVar8 == 5) || (uVar8 == 0)) {
    if (pnLog != (int *)0x0) {
      *pnLog = (pWal->hdr).mxFrame;
    }
    if (pnCkpt != (int *)0x0) {
      *pnCkpt = (*pWal->apWiData)[0x18];
    }
  }
LAB_0013a72e:
  if (local_174 != 0) {
    (pWal->hdr).aSalt[0] = 0;
    (pWal->hdr).aSalt[1] = 0;
    (pWal->hdr).aCksum[0] = 0;
    (pWal->hdr).aCksum[1] = 0;
    (pWal->hdr).mxFrame = 0;
    (pWal->hdr).nPage = 0;
    (pWal->hdr).aFrameCksum[0] = 0;
    (pWal->hdr).aFrameCksum[1] = 0;
    (pWal->hdr).iVersion = 0;
    (pWal->hdr).unused = 0;
    (pWal->hdr).iChange = 0;
    (pWal->hdr).isInit = '\0';
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).szPage = 0;
  }
  sqlite3WalEndWriteTransaction(pWal);
  if (pWal->exclusiveMode == '\0') {
    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,1,1,9);
  }
  uVar15 = 5;
  if (uVar8 != 0) {
    uVar15 = uVar8;
  }
  pWal->ckptLock = '\0';
  if (iVar7 == local_154) {
    uVar15 = uVar8;
  }
  return uVar15;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive 
  ** "checkpoint" lock on the database file. */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  if( rc ){
    /* EVIDENCE-OF: R-10421-19736 If any other process is running a
    ** checkpoint operation at the same time, the lock cannot be obtained and
    ** SQLITE_BUSY is returned.
    ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
    ** it will not be invoked in this case.
    */
    testcase( rc==SQLITE_BUSY );
    testcase( xBusy!=0 );
    return rc;
  }
  pWal->ckptLock = 1;

  /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
  ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
  ** file.
  **
  ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
  ** immediately, and a busy-handler is configured, it is invoked and the
  ** writer lock retried until either the busy-handler returns 0 or the
  ** lock is successfully obtained.
  */
  if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
    rc = walBusyLock(pWal, xBusy, pBusyArg, WAL_WRITE_LOCK, 1);
    if( rc==SQLITE_OK ){
      pWal->writeLock = 1;
    }else if( rc==SQLITE_BUSY ){
      eMode2 = SQLITE_CHECKPOINT_PASSIVE;
      xBusy2 = 0;
      rc = SQLITE_OK;
    }
  }

  /* Read the wal-index header. */
  if( rc==SQLITE_OK ){
    rc = walIndexReadHdr(pWal, &isChanged);
    if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
      sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
    }
  }

  /* Copy data from the log to the database file. */
  if( rc==SQLITE_OK ){

    if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags, zBuf);
    }

    /* If no error occurred, set the output variables. */
    if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
      if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
      if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
    }
  }

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was 
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
  pWal->ckptLock = 0;
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}